

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockcache.cc
# Opt level: O2

void bcache_print_items(void)

{
  byte bVar1;
  char cVar2;
  fnamedic_item *pfVar3;
  avl_node *paVar4;
  avl_node *node;
  ulong uVar5;
  list_elem *plVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  string ss_local;
  string ss;
  long local_16b0;
  size_t scores_local [100];
  size_t scores [100];
  char tmp_buf [4096];
  
  ss._M_dataplus._M_p = (pointer)&ss.field_2;
  ss._M_string_length = 0;
  ss.field_2._M_local_buf[0] = '\0';
  ss_local._M_dataplus._M_p = (pointer)&ss_local.field_2;
  ss_local._M_string_length = 0;
  ss_local.field_2._M_local_buf[0] = '\0';
  memset(scores,0,800);
  builtin_strncpy(tmp_buf," === Block cache statistics summary ===\n",0x29);
  std::__cxx11::string::append((char *)&ss_local);
  snprintf(tmp_buf,0xfff,"%3s %20s (%6s)(%6s)(c%6s d%6s)","No","Filename","#Pages","#Evict","Clean",
           "Dirty");
  std::__cxx11::string::append((char *)&ss_local);
  snprintf(tmp_buf,0xfff,"%6s%6s","Doc","Node");
  std::__cxx11::string::append((char *)&ss_local);
  for (uVar9 = 0; uVar9 != 2; uVar9 = uVar9 + 1) {
    snprintf(tmp_buf,0xfff,"   [%d] ",uVar9 & 0xffffffff);
    std::__cxx11::string::append((char *)&ss_local);
  }
  tmp_buf[0] = '\n';
  tmp_buf[1] = '\0';
  std::__cxx11::string::append((char *)&ss_local);
  reader_lock(&filelist_lock);
  local_16b0 = 0;
  uVar9 = 0;
  uVar8 = 0;
  for (uVar13 = 0; uVar13 < num_files; uVar13 = uVar13 + 1) {
    pfVar3 = file_list[uVar13];
    uVar11 = 0;
    memset(scores_local,0,800);
    uVar10 = 0;
    uVar14 = 0;
    uVar12 = 0;
    for (uVar5 = 0; uVar5 < pfVar3->num_shards; uVar5 = uVar5 + 1) {
      pthread_spin_lock(&pfVar3->shards[uVar5].lock);
      plVar6 = pfVar3->shards[uVar5].cleanlist.head;
      node = avl_first(&pfVar3->shards[uVar5].tree);
      for (; plVar6 != (list_elem *)0x0; plVar6 = plVar6->next) {
        bVar1 = *(byte *)((long)&plVar6[1].prev + 1);
        scores[bVar1] = scores[bVar1] + 1;
        scores_local[bVar1] = scores_local[bVar1] + 1;
        cVar2 = *(char *)((long)plVar6[-2].prev + (long)bcache_blocksize + -1);
        if (cVar2 == -0x23) {
          uVar14 = uVar14 + 1;
        }
        else if (cVar2 == -1) {
          uVar12 = uVar12 + 1;
        }
        uVar11 = (ulong)((int)uVar11 + 1);
        uVar8 = uVar8 + 1;
      }
      for (; node != (avl_node *)0x0; node = avl_next(node)) {
        paVar4 = node[-1].right;
        bVar1 = *(byte *)((long)&paVar4[2].left + 1);
        scores[bVar1] = scores[bVar1] + 1;
        scores_local[bVar1] = scores_local[bVar1] + 1;
        cVar2 = *(char *)((long)paVar4->left + (long)bcache_blocksize + -1);
        if (cVar2 == -0x23) {
          uVar14 = uVar14 + 1;
        }
        else if (cVar2 == -1) {
          uVar12 = uVar12 + 1;
        }
        uVar10 = (ulong)((int)uVar10 + 1);
        uVar8 = uVar8 + 1;
      }
      pthread_spin_unlock(&pfVar3->shards[uVar5].lock);
    }
    snprintf(tmp_buf,0xfff,"%3d %20s (%6d)(%6d)(c%6d d%6d)",(ulong)((int)uVar13 + 1),
             pfVar3->filename,(pfVar3->nitems).super___atomic_base<unsigned_long>._M_i,
             (pfVar3->nvictim).super___atomic_base<unsigned_long>._M_i,uVar11,uVar10);
    std::__cxx11::string::append((char *)&ss_local);
    snprintf(tmp_buf,0xfff,"%6d%6d",uVar14 & 0xffffffff,uVar12 & 0xffffffff);
    std::__cxx11::string::append((char *)&ss_local);
    for (lVar7 = 0; lVar7 != 2; lVar7 = lVar7 + 1) {
      snprintf(tmp_buf,0xfff,"%6d ",(ulong)(uint)scores_local[lVar7]);
      std::__cxx11::string::append((char *)&ss_local);
    }
    tmp_buf[0] = '\n';
    tmp_buf[1] = '\0';
    std::__cxx11::string::append((char *)&ss_local);
    if (4000 < ss_local._M_string_length + ss._M_string_length) {
      fdb_log_impl((err_log_callback *)0x0,4,FDB_RESULT_SUCCESS,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/blockcache.cc"
                   ,"bcache_print_items",0x64e,"%s",ss._M_dataplus._M_p);
      ss._M_string_length = 0;
      *ss._M_dataplus._M_p = '\0';
    }
    std::__cxx11::string::append((string *)&ss);
    local_16b0 = local_16b0 + uVar14;
    ss_local._M_string_length = 0;
    uVar9 = uVar9 + uVar12;
    *ss_local._M_dataplus._M_p = '\0';
  }
  reader_unlock(&filelist_lock);
  builtin_strncpy(tmp_buf," ===\n",6);
  std::__cxx11::string::append((char *)&ss_local);
  snprintf(tmp_buf,0xfff,"%d files %d items\n",uVar13 & 0xffffffff,(ulong)uVar8);
  std::__cxx11::string::append((char *)&ss_local);
  for (uVar13 = 0; uVar13 != 2; uVar13 = uVar13 + 1) {
    snprintf(tmp_buf,0xfff,"[%d]: %d\n",uVar13 & 0xffffffff,(ulong)(uint)scores[uVar13]);
    std::__cxx11::string::append((char *)&ss_local);
  }
  snprintf(tmp_buf,0xfff,"Documents: %d blocks\n",local_16b0);
  std::__cxx11::string::append((char *)&ss_local);
  snprintf(tmp_buf,0xfff,"Index nodes: %d blocks\n",uVar9 & 0xffffffff);
  std::__cxx11::string::append((char *)&ss_local);
  if (4000 < ss_local._M_string_length + ss._M_string_length) {
    fdb_log_impl((err_log_callback *)0x0,4,FDB_RESULT_SUCCESS,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/blockcache.cc"
                 ,"bcache_print_items",0x65f,"%s",ss._M_dataplus._M_p);
    ss._M_string_length = 0;
    *ss._M_dataplus._M_p = '\0';
  }
  std::__cxx11::string::append((string *)&ss);
  ss_local._M_string_length = 0;
  *ss_local._M_dataplus._M_p = '\0';
  fdb_log_impl((err_log_callback *)0x0,4,FDB_RESULT_SUCCESS,
               "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/blockcache.cc"
               ,"bcache_print_items",0x664,"%s",ss._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&ss_local);
  std::__cxx11::string::~string((string *)&ss);
  return;
}

Assistant:

void bcache_print_items()
{
    std::string ss;
    std::string ss_local;
    char tmp_buf[4096];
    size_t n=1;
    size_t nfiles, nitems, nfileitems, nclean, ndirty;
    size_t scores[100], i, scores_local[100];
    size_t docs, bnodes;
    size_t docs_local, bnodes_local;
    uint8_t *ptr;

    nfiles = nitems = nfileitems = nclean = ndirty = 0;
    docs = bnodes = 0;
    memset(scores, 0, sizeof(size_t)*100);

    struct fnamedic_item *fname;
    struct bcache_item *item;
    struct dirty_item *dirty;
    struct list_elem *ee;
    struct avl_node *a;

    ADD2BUF(" === Block cache statistics summary ===\n");
    ADD2BUF("%3s %20s (%6s)(%6s)(c%6s d%6s)",
        "No", "Filename", "#Pages", "#Evict", "Clean", "Dirty");
#ifdef __CRC32
    ADD2BUF("%6s%6s", "Doc", "Node");
#endif
    for (i=0;i<=n;++i) {
        ADD2BUF("   [%d] ", (int)i);
    }
    ADD2BUF("\n");

    reader_lock(&filelist_lock);
    for (size_t idx = 0; idx < num_files; ++idx) {
        fname = file_list[idx];
        memset(scores_local, 0, sizeof(size_t)*100);
        nfileitems = nclean = ndirty = 0;
        docs_local = bnodes_local = 0;

        size_t i = 0;
        for (; i < fname->num_shards; ++i) {
            spin_lock(&fname->shards[i].lock);
            ee = list_begin(&fname->shards[i].cleanlist);
            a = avl_first(&fname->shards[i].tree);

            while(ee){
                item = _get_entry(ee, struct bcache_item, list_elem);
                scores[item->score]++;
                scores_local[item->score]++;
                nitems++;
                nfileitems++;
                nclean++;
#ifdef __CRC32
                ptr = (uint8_t*)item->addr + bcache_blocksize - 1;
                switch (*ptr) {
                case BLK_MARKER_BNODE:
                    bnodes_local++;
                    break;
                case BLK_MARKER_DOC:
                    docs_local++;
                    break;
                }
#endif
                ee = list_next(ee);
            }
            while(a){
                dirty = _get_entry(a, struct dirty_item, avl);
                item = dirty->item;
                scores[item->score]++;
                scores_local[item->score]++;
                nitems++;
                nfileitems++;
                ndirty++;
#ifdef __CRC32
                ptr = (uint8_t*)item->addr + bcache_blocksize - 1;
                switch (*ptr) {
                case BLK_MARKER_BNODE:
                    bnodes_local++;
                    break;
                case BLK_MARKER_DOC:
                    docs_local++;
                    break;
                }
#endif
                a = avl_next(a);
            }
            spin_unlock(&fname->shards[i].lock);
        }

        ADD2BUF("%3d %20s (%6d)(%6d)(c%6d d%6d)",
               (int)nfiles+1, fname->filename,
               (int)atomic_get_uint64_t(&fname->nitems),
               (int)atomic_get_uint64_t(&fname->nvictim),
               (int)nclean, (int)ndirty);
        ADD2BUF("%6d%6d", (int)docs_local, (int)bnodes_local);
        for (i=0;i<=n;++i){
            ADD2BUF("%6d ", (int)scores_local[i]);
        }
        ADD2BUF("\n");

        docs += docs_local;
        bnodes += bnodes_local;

        nfiles++;

        if (ss.size() + ss_local.size() > 4000) {
            BCACHE_LOG("%s", ss.c_str());
            ss.clear();
        }
        ss += ss_local;
        ss_local.clear();
    }
    reader_unlock(&filelist_lock);
    ADD2BUF(" ===\n");

    ADD2BUF("%d files %d items\n", (int)nfiles, (int)nitems);
    for (i=0;i<=n;++i){
        ADD2BUF("[%d]: %d\n", (int)i, (int)scores[i]);
    }
    ADD2BUF("Documents: %d blocks\n", (int)docs);
    ADD2BUF("Index nodes: %d blocks\n", (int)bnodes);

    if (ss.size() + ss_local.size() > 4000) {
        BCACHE_LOG("%s", ss.c_str());
        ss.clear();
    }
    ss += ss_local;
    ss_local.clear();
    BCACHE_LOG("%s", ss.c_str());
}